

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_ordinaryFunction_memoizedApply
          (sysbvm_context_t *context,sysbvm_tuple_t function_,size_t argumentCount,
          sysbvm_tuple_t *arguments,sysbvm_bitflags_t applicationFlags)

{
  _Bool _Var1;
  sysbvm_tuple_t sVar2;
  ulong local_130;
  size_t i_1;
  sysbvm_tuple_t templateArguments [16];
  size_t i;
  sysbvm_function_t **functionObject;
  sysbvm_stackFrameGCRootsRecord_t argumentsRecord;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_32_4_e25266d4 gcFrame;
  sysbvm_bitflags_t applicationFlags_local;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t function__local;
  sysbvm_context_t *context_local;
  
  gcFrame.result = applicationFlags;
  memset(&gcFrameRecord.roots,0,0x20);
  gcFrameRecord.roots = (sysbvm_tuple_t *)function_;
  memset(&argumentsRecord.roots,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_BREAK_TARGET;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord.roots);
  functionObject = (sysbvm_function_t **)0x0;
  argumentsRecord.previous._0_4_ = 0;
  argumentsRecord._8_8_ = argumentCount;
  argumentsRecord.rootCount = (size_t)arguments;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&functionObject);
  if (argumentCount < 2) {
    if (argumentCount == 1) {
      gcFrame.function = *arguments;
    }
  }
  else {
    gcFrame.function = sysbvm_array_create(context,argumentCount);
    for (templateArguments[0xf] = 0; templateArguments[0xf] < argumentCount;
        templateArguments[0xf] = templateArguments[0xf] + 1) {
      sysbvm_array_atPut(gcFrame.function,templateArguments[0xf],arguments[templateArguments[0xf]]);
    }
  }
  if (gcFrameRecord.roots[0xc] == 0) {
    sVar2 = sysbvm_weakValueDictionary_create(context);
    gcFrameRecord.roots[0xc] = sVar2;
  }
  _Var1 = sysbvm_weakValueDictionary_find
                    (context,gcFrameRecord.roots[0xc],gcFrame.function,
                     &gcFrame.memoizationAssociation);
  if (_Var1) {
    if (gcFrame.memoizationAssociation == 0x5f) {
      sysbvm_error("Computing cyclic memoized value.");
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&functionObject);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord.roots);
  }
  else {
    sysbvm_weakValueDictionary_atPut(context,gcFrameRecord.roots[0xc],gcFrame.function,0x5f);
    sysbvm_weakValueDictionary_findAssociation
              (context,gcFrameRecord.roots[0xc],gcFrame.function,&gcFrame.memoizationKey);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&functionObject);
    _Var1 = sysbvm_function_isTemplate(context,(sysbvm_tuple_t)gcFrameRecord.roots);
    if (_Var1) {
      if (0x10 < argumentCount + 1) {
        sysbvm_error_assertionFailure
                  (
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/ronsaldo[P]sysmel/lib/sysbvm/function.c:305: assertion failure: argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS"
                  );
      }
      i_1 = gcFrame.memoizationKey;
      for (local_130 = 0; local_130 < argumentCount; local_130 = local_130 + 1) {
        templateArguments[local_130] = arguments[local_130];
      }
      gcFrame.memoizationAssociation =
           sysbvm_ordinaryFunction_directApply
                     (context,(sysbvm_tuple_t)gcFrameRecord.roots,argumentCount + 1,&i_1,
                      gcFrame.result);
    }
    else {
      gcFrame.memoizationAssociation =
           sysbvm_ordinaryFunction_directApply
                     (context,(sysbvm_tuple_t)gcFrameRecord.roots,argumentCount,arguments,
                      gcFrame.result);
    }
    sysbvm_association_setValue(gcFrame.memoizationKey,gcFrame.memoizationAssociation);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&argumentsRecord.roots);
  }
  return gcFrame.memoizationAssociation;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_ordinaryFunction_memoizedApply(sysbvm_context_t *context, sysbvm_tuple_t function_, size_t argumentCount, sysbvm_tuple_t *arguments, sysbvm_bitflags_t applicationFlags)
{
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t memoizationKey;
        sysbvm_tuple_t memoizationAssociation;
        sysbvm_tuple_t result;
    } gcFrame = {
        .function = function_
    };
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    sysbvm_stackFrameGCRootsRecord_t argumentsRecord = {
        .type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS,
        .rootCount = argumentCount,
        .roots = arguments
    };
    sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    sysbvm_function_t **functionObject = (sysbvm_function_t**)&gcFrame.function;

    // Make the memoization lookup key.
    if(argumentCount > 1)
    {
        gcFrame.memoizationKey = sysbvm_array_create(context, argumentCount);
        for(size_t i = 0; i < argumentCount; ++i)
            sysbvm_array_atPut(gcFrame.memoizationKey, i , arguments[i]);
    }
    else if(argumentCount == 1)
    {
        gcFrame.memoizationKey = arguments[0];
    }

    // Find the result in the memoization table
    if(!(*functionObject)->memoizationTable)
        (*functionObject)->memoizationTable = sysbvm_weakValueDictionary_create(context);

    if(sysbvm_weakValueDictionary_find(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.result))
    {
        if(gcFrame.result == SYSBVM_PENDING_MEMOIZATION_VALUE)
            sysbvm_error("Computing cyclic memoized value.");

        sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else
    {
        sysbvm_weakValueDictionary_atPut(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, SYSBVM_PENDING_MEMOIZATION_VALUE);
        sysbvm_weakValueDictionary_findAssociation(context, (*functionObject)->memoizationTable, gcFrame.memoizationKey, &gcFrame.memoizationAssociation);
    }

    // Apply the actual function.
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t*)&argumentsRecord);

    if(sysbvm_function_isTemplate(context, gcFrame.function))
    {
        SYSBVM_ASSERT(argumentCount + 1 <= SYSBVM_MAX_FUNCTION_ARGUMENTS);
        sysbvm_tuple_t templateArguments[SYSBVM_MAX_FUNCTION_ARGUMENTS];
        templateArguments[0] = gcFrame.memoizationAssociation;
        for(size_t i = 0; i < argumentCount; ++i)
            templateArguments[i + 1] = arguments[i];

        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount + 1, templateArguments, applicationFlags);
    }
    else
    {
        gcFrame.result = sysbvm_ordinaryFunction_directApply(context, gcFrame.function, argumentCount, arguments, applicationFlags);
    }

    // Store the result
    sysbvm_association_setValue(gcFrame.memoizationAssociation, gcFrame.result);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}